

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O2

void __thiscall tinyusdz::value::AssetPath::~AssetPath(AssetPath *this)

{
  ::std::__cxx11::string::~string((string *)&this->resolved_path_);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssetPath() = default;